

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O3

void __thiscall ev3dev::led::flash(led *this,uint on_ms,uint off_ms)

{
  int iVar1;
  int *piVar2;
  timespec local_d8;
  string local_c8;
  led local_a8;
  led local_80;
  led local_58;
  
  if (flash(unsigned_int,unsigned_int)::timer_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&flash(unsigned_int,unsigned_int)::timer_abi_cxx11_);
    if (iVar1 != 0) {
      flash(unsigned_int,unsigned_int)::timer_abi_cxx11_._M_dataplus._M_p =
           (pointer)&flash(unsigned_int,unsigned_int)::timer_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&flash(unsigned_int,unsigned_int)::timer_abi_cxx11_,"timer","");
      __cxa_atexit(std::__cxx11::string::~string,&flash(unsigned_int,unsigned_int)::timer_abi_cxx11_
                   ,&__dso_handle);
      __cxa_guard_release(&flash(unsigned_int,unsigned_int)::timer_abi_cxx11_);
    }
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,flash(unsigned_int,unsigned_int)::timer_abi_cxx11_._M_dataplus._M_p
             ,flash(unsigned_int,unsigned_int)::timer_abi_cxx11_._M_dataplus._M_p +
              flash(unsigned_int,unsigned_int)::timer_abi_cxx11_._M_string_length);
  set_trigger(&local_58,this,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.super_device._path._M_dataplus._M_p != &local_58.super_device._path.field_2) {
    operator_delete(local_58.super_device._path._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (on_ms != 0) {
    local_d8.tv_sec = 0;
    local_d8.tv_nsec = 100000000;
    do {
      iVar1 = nanosleep(&local_d8,&local_d8);
      if (iVar1 != -1) break;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    set_delay_on(&local_a8,this,on_ms);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.super_device._path._M_dataplus._M_p != &local_a8.super_device._path.field_2) {
      operator_delete(local_a8.super_device._path._M_dataplus._M_p);
    }
    set_delay_off(&local_80,this,off_ms);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.super_device._path._M_dataplus._M_p != &local_80.super_device._path.field_2) {
      operator_delete(local_80.super_device._path._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void led::flash(unsigned on_ms, unsigned off_ms) {
    static const mode_type timer("timer");
    set_trigger(timer);
    if (on_ms) {
        // A workaround for ev3dev/ev3dev#225.
        // It takes some time for delay_{on,off} sysfs attributes to appear after
        // led trigger has been set to "timer".
        for (int i = 0; ; ++i) {
            std::this_thread::sleep_for(std::chrono::milliseconds(100));
            try {
                set_delay_on (on_ms );
                set_delay_off(off_ms);
                break;
            } catch(...) {
                if (i >= 5) throw;
            }
        }
    }
}